

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O0

void __thiscall
leveldb::CorruptionTest_NewFileErrorDuringWrite_Test::~CorruptionTest_NewFileErrorDuringWrite_Test
          (CorruptionTest_NewFileErrorDuringWrite_Test *this)

{
  CorruptionTest_NewFileErrorDuringWrite_Test *this_local;
  
  ~CorruptionTest_NewFileErrorDuringWrite_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(CorruptionTest, NewFileErrorDuringWrite) {
  // Do enough writing to force minor compaction
  env_.writable_file_error_ = true;
  const int num = 3 + (Options().write_buffer_size / kValueSize);
  std::string value_storage;
  Status s;
  for (int i = 0; s.ok() && i < num; i++) {
    WriteBatch batch;
    batch.Put("a", Value(100, &value_storage));
    s = db_->Write(WriteOptions(), &batch);
  }
  ASSERT_TRUE(!s.ok());
  ASSERT_GE(env_.num_writable_file_errors_, 1);
  env_.writable_file_error_ = false;
  Reopen();
}